

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O2

void store_read_reset(png_store *ps)

{
  jmp_buf *pa_Var1;
  int iVar2;
  exception_context *the_exception_context;
  jmp_buf exception__env;
  
  if (ps->pread != (png_structp)0x0) {
    pa_Var1 = (ps->exception_context).penv;
    (ps->exception_context).penv = &exception__env;
    iVar2 = _setjmp((__jmp_buf_tag *)exception__env);
    if (iVar2 == 0) {
      png_destroy_read_struct(&ps->pread,&ps->piread,0);
    }
    (ps->exception_context).caught = (uint)(iVar2 != 0);
    (ps->exception_context).penv = pa_Var1;
    ps->pread = (png_structp)0x0;
    ps->piread = (png_infop)0x0;
  }
  store_pool_delete(ps,&ps->read_memory_pool);
  ps->readpos = 0;
  ps->current = (png_store_file *)0x0;
  ps->next = (png_store_buffer *)0x0;
  ps->field_0x18 = ps->field_0x18 & 0x7f;
  ps->chunklen = 0x10;
  ps->chunktype = 0;
  ps->chunkpos = 8;
  ps->IDAT_size = 0;
  return;
}

Assistant:

static void
store_read_reset(png_store *ps)
{
#  ifdef PNG_READ_SUPPORTED
      if (ps->pread != NULL)
      {
         anon_context(ps);

         Try
            png_destroy_read_struct(&ps->pread, &ps->piread, NULL);

         Catch_anonymous
         {
            /* error already output: continue */
         }

         ps->pread = NULL;
         ps->piread = NULL;
      }
#  endif

#  ifdef PNG_USER_MEM_SUPPORTED
      /* Always do this to be safe. */
      store_pool_delete(ps, &ps->read_memory_pool);
#  endif

   ps->current = NULL;
   ps->next = NULL;
   ps->readpos = 0;
   ps->validated = 0;

   ps->chunkpos = 8;
   ps->chunktype = 0;
   ps->chunklen = 16;
   ps->IDAT_size = 0;
}